

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeHistogram.cpp
# Opt level: O0

void __thiscall OpenMD::ChargeHistogram::process(ChargeHistogram *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  Snapshot *pSVar2;
  reference pvVar3;
  size_type sVar4;
  reference pdVar5;
  DumpReader *in_RDI;
  RealType RVar6;
  undefined1 auVar7 [16];
  bool hist_update;
  RealType charge_length;
  iterator index;
  int bin_center_pos;
  int j;
  RealType delta_charge;
  RealType max;
  RealType min;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  Atom *atom;
  RealType q;
  int istep;
  vector<double,_std::allocator<double>_> charge;
  int nFrames;
  DumpReader reader;
  int ii;
  StuntDouble *sd;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffebf8;
  DumpReader *in_stack_ffffffffffffec00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffec08;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffec10;
  undefined7 in_stack_ffffffffffffec38;
  undefined1 in_stack_ffffffffffffec3f;
  undefined1 *in_stack_ffffffffffffec88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1340;
  int local_1334;
  undefined8 local_1330;
  double local_1328;
  int local_131c;
  undefined8 local_1318;
  double local_1310;
  double local_1308;
  double local_1300;
  double *local_12f8;
  double *local_12f0;
  FluctuatingChargeAdapter local_12e8;
  FixedChargeAdapter local_12e0;
  AtomType *local_12d8;
  Atom *local_12d0;
  double local_12c8;
  int local_12bc;
  vector<double,_std::allocator<double>_> local_12b8;
  int local_129c;
  string *in_stack_ffffffffffffee50;
  SimInfo *in_stack_ffffffffffffee58;
  DumpReader *in_stack_ffffffffffffee60;
  undefined1 local_30 [32];
  Atom *local_10;
  
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&in_RDI->field_0xf8);
  if (bVar1) {
    in_stack_ffffffffffffec88 = local_30;
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38));
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_ffffffffffffec10._M_current,
               (SelectionSet *)in_stack_ffffffffffffec08._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x1faf6d);
  }
  DumpReader::DumpReader
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,in_stack_ffffffffffffee50);
  local_129c = DumpReader::getNFrames(in_stack_ffffffffffffec00);
  *(int *)&in_RDI->field_0xd0 = local_129c / *(int *)&in_RDI->inFile_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1fb008);
  *(int *)&in_RDI->field_0xd0 = local_129c / *(int *)&in_RDI->inFile_;
  for (local_12bc = 0; local_12bc < local_129c; local_12bc = *(int *)&in_RDI->inFile_ + local_12bc)
  {
    DumpReader::readFrame(in_RDI,(int)((ulong)in_stack_ffffffffffffec88 >> 0x20));
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)&in_RDI->filename_);
    pSVar2 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)&in_RDI->field_0xc8 = pSVar2;
    local_10 = (Atom *)SelectionManager::beginSelected
                                 ((SelectionManager *)in_stack_ffffffffffffec10._M_current,
                                  (int *)in_stack_ffffffffffffec08._M_current);
    while (local_10 != (Atom *)0x0) {
      local_12c8 = 0.0;
      local_12d0 = local_10;
      local_12d8 = Atom::getAtomType(local_10);
      FixedChargeAdapter::FixedChargeAdapter(&local_12e0,local_12d8);
      bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1fb135);
      if (bVar1) {
        RVar6 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffec00);
        local_12c8 = RVar6 + local_12c8;
      }
      FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_12e8,local_12d8);
      bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x1fb1d7);
      if (bVar1) {
        RVar6 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffec00);
        local_12c8 = RVar6 + local_12c8;
      }
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec10._M_current,
                 in_stack_ffffffffffffec08._M_current);
      local_10 = (Atom *)SelectionManager::nextSelected
                                   ((SelectionManager *)in_stack_ffffffffffffec10._M_current,
                                    (int *)in_stack_ffffffffffffec08._M_current);
    }
  }
  bVar1 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec10._M_current
                    );
  if (bVar1) {
    snprintf(painCave.errMsg,2000,"Selected atom not found.\n");
    painCave.isFatal = 1;
    simError();
  }
  local_12f0 = (double *)
               std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffebf8);
  local_12f8 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffebf8);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  pvVar3 = std::vector<double,_std::allocator<double>_>::front
                     ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec00);
  local_1300 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::back
                     ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec00);
  local_1308 = *pvVar3;
  local_1310 = (local_1308 - local_1300) / (double)*(int *)(in_RDI->buffer + 0x4ba);
  if ((local_1310 == 0.0) && (!NAN(local_1310))) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec10._M_current,
               in_stack_ffffffffffffec08._M_current);
    local_1318 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec00,
               (value_type_conflict2 *)in_stack_ffffffffffffebf8);
LAB_001fb66e:
    (*(code *)(in_RDI->info_->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)();
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec10._M_current);
    DumpReader::~DumpReader(in_stack_ffffffffffffec00);
    return;
  }
  for (local_131c = 0; local_131c < *(int *)(in_RDI->buffer + 0x4ba) + 3;
      local_131c = local_131c + 1) {
    local_1328 = (double)(local_131c + -1) * local_1310 + local_1300;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec00,
               (value_type_conflict2 *)in_stack_ffffffffffffebf8);
    local_1330 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec00,
               (value_type_conflict2 *)in_stack_ffffffffffffebf8);
  }
  local_1334 = 0;
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_1340);
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_12b8);
  auVar7._8_4_ = (int)(sVar4 >> 0x20);
  auVar7._0_8_ = sVar4;
  auVar7._12_4_ = 0x45300000;
  local_1340._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffebf8);
LAB_001fb511:
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffebf8);
  bVar1 = __gnu_cxx::operator<
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     in_stack_ffffffffffffec00,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     in_stack_ffffffffffffebf8);
  if (bVar1) {
    bVar1 = true;
LAB_001fb54c:
    do {
      if (!bVar1) goto LAB_001fb650;
      pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_1340);
      in_stack_ffffffffffffec10._M_current = (double *)*pdVar5;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4c2),
                          (long)local_1334);
      if (*pvVar3 <= (double)in_stack_ffffffffffffec10._M_current) {
        pdVar5 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_1340);
        in_stack_ffffffffffffec08._M_current = (double *)*pdVar5;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4c2),
                            (long)(local_1334 + 1));
        if ((double)in_stack_ffffffffffffec08._M_current < *pvVar3) {
          in_stack_ffffffffffffec00 =
               (DumpReader *)
               (1.0 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4da),
                              (long)local_1334);
          *pvVar3 = (double)in_stack_ffffffffffffec00 + *pvVar3;
          bVar1 = false;
          goto LAB_001fb54c;
        }
      }
      local_1334 = local_1334 + 1;
      bVar1 = true;
    } while( true );
  }
  goto LAB_001fb66e;
LAB_001fb650:
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator++
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             in_stack_ffffffffffffec08._M_current,(int)((ulong)in_stack_ffffffffffffec00 >> 0x20));
  goto LAB_001fb511;
}

Assistant:

void ChargeHistogram::process() {
    StuntDouble* sd;
    int ii;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;
    vector<RealType> charge;

    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        RealType q = 0.0;
        Atom* atom = static_cast<Atom*>(sd);

        AtomType* atomType = atom->getAtomType();

        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        if (fca.isFixedCharge()) { q += fca.getCharge(); }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }

        charge.push_back(q);
      }
    }

    if (charge.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Selected atom not found.\n");
      painCave.isFatal = 1;
      simError();
    }

    std::sort(charge.begin(), charge.end());

    RealType min = charge.front();
    RealType max = charge.back();

    RealType delta_charge = (max - min) / (nBins_);

    if (delta_charge == 0) {
      bincenter_.push_back(min);
      histList_.push_back(1);
    } else {
      // fill the center for histogram
      for (int j = 0; j < nBins_ + 3; ++j) {
        bincenter_.push_back(min + (j - 1) * delta_charge);
        histList_.push_back(0);
      }
      // filling up the histogram whith the densities
      int bin_center_pos = 0;
      vector<RealType>::iterator index;
      RealType charge_length = static_cast<RealType>(charge.size());

      bool hist_update;
      for (index = charge.begin(); index < charge.end(); index++) {
        hist_update = true;
        while (hist_update) {
          if (*index >= bincenter_[bin_center_pos] &&
              *index < bincenter_[bin_center_pos + 1]) {
            histList_[bin_center_pos] += 1.0 / charge_length;
            hist_update = false;
          } else {
            bin_center_pos++;
            hist_update = true;
          }
        }
      }
    }
    writeCharge();
  }